

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.cpp
# Opt level: O0

pointer stream::chunk_reader::get(slice_reader *base,chunk *chunk,string *key)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar5;
  size_t in_RCX;
  uint *__nbytes;
  long in_RDX;
  slice_reader *in_RSI;
  __uniq_ptr_data<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  in_RDI;
  char nonce [24];
  size_t key_length;
  char *salted_key;
  checksum checksum;
  hasher hasher;
  char salt [8];
  char magic [4];
  pointer *result;
  string *in_stack_fffffffffffffb78;
  inno_xchacha20_crypter *in_stack_fffffffffffffb80;
  uint value;
  undefined4 in_stack_fffffffffffffb88;
  checksum_type in_stack_fffffffffffffb8c;
  hasher *in_stack_fffffffffffffb90;
  restricted_source<stream::slice_reader> *in_stack_fffffffffffffb98;
  chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
  *in_stack_fffffffffffffba0;
  slice_reader *in_stack_fffffffffffffba8;
  allocator<char> *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  undefined1 local_f2 [8];
  undefined1 local_ea;
  undefined1 local_83;
  undefined1 local_82;
  int local_59;
  undefined1 local_55;
  long local_18;
  slice_reader *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = slice_reader::seek(in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0,
                             (uint32_t)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  if (!bVar2) {
    local_55 = 1;
    uVar3 = __cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    chunk_error::chunk_error((chunk_error *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_55 = 0;
    __cxa_throw(uVar3,&chunk_error::typeinfo,slice_error::~slice_error);
  }
  sVar4 = slice_reader::read(local_10,(int)&local_59,(void *)0x4,in_RCX);
  if ((sVar4 == 4) && (local_59 == 0x1a626c7a)) {
    local_83 = 0;
    operator_new(0x10);
    boost::iostreams::
    chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>::chain
              ((chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>
                *)0x19ee45);
    std::
    unique_ptr<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,std::default_delete<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>>
    ::
    unique_ptr<std::default_delete<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>,void>
              ((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb80,(pointer)in_stack_fffffffffffffb78);
    __nbytes = &switchD_0019ee8f::switchdataD_001cd0a8;
    switch(*(undefined4 *)(local_18 + 0x18)) {
    case 0:
      break;
    case 1:
      std::
      unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x19eece);
      boost::iostreams::basic_zlib_decompressor<std::allocator<char>_>::basic_zlib_decompressor
                ((basic_zlib_decompressor<std::allocator<char>_> *)in_stack_fffffffffffffb80,
                 (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),0x19eeed);
      __nbytes = (uint *)0xffffffffffffffff;
      boost::iostreams::detail::
      chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
      ::push<boost::iostreams::basic_zlib_decompressor<std::allocator<char>>>
                (in_stack_fffffffffffffba0,
                 (basic_zlib_decompressor<std::allocator<char>_> *)in_stack_fffffffffffffb98,
                 (streamsize)in_stack_fffffffffffffb90,
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80);
      boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>::~basic_bzip2_decompressor
                ((chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>
                  *)0x19ef24);
      break;
    case 2:
      std::
      unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x19ef75);
      boost::iostreams::basic_bzip2_decompressor<std::allocator<char>_>::basic_bzip2_decompressor
                ((basic_bzip2_decompressor<std::allocator<char>_> *)in_stack_fffffffffffffb80,
                 SUB81((ulong)in_stack_fffffffffffffb78 >> 0x38,0),0x19ef91);
      __nbytes = (uint *)0xffffffffffffffff;
      boost::iostreams::detail::
      chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
      ::push<boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>>
                (in_stack_fffffffffffffba0,
                 (basic_bzip2_decompressor<std::allocator<char>_> *)in_stack_fffffffffffffb98,
                 (streamsize)in_stack_fffffffffffffb90,
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80);
      boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>::~basic_bzip2_decompressor
                ((chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>
                  *)0x19efc8);
      break;
    case 3:
      std::
      unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x19f000);
      lzma_decompressor<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>::
      lzma_decompressor((lzma_decompressor<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_>
                         *)in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20)
                       );
      __nbytes = (uint *)0xffffffffffffffff;
      boost::iostreams::detail::
      chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
      ::push<stream::lzma_decompressor<stream::inno_lzma1_decompressor_impl,std::allocator<char>>>
                (in_stack_fffffffffffffba0,
                 (lzma_decompressor<stream::inno_lzma1_decompressor_impl,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb98,(streamsize)in_stack_fffffffffffffb90,
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80);
      boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>::~basic_bzip2_decompressor
                ((chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>
                  *)0x19f051);
      break;
    case 4:
      std::
      unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x19f089);
      lzma_decompressor<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>::
      lzma_decompressor((lzma_decompressor<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_>
                         *)in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20)
                       );
      __nbytes = (uint *)0xffffffffffffffff;
      boost::iostreams::detail::
      chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
      ::push<stream::lzma_decompressor<stream::inno_lzma2_decompressor_impl,std::allocator<char>>>
                (in_stack_fffffffffffffba0,
                 (lzma_decompressor<stream::inno_lzma2_decompressor_impl,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb98,(streamsize)in_stack_fffffffffffffb90,
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80);
      boost::iostreams::basic_bzip2_decompressor<std::allocator<char>>::~basic_bzip2_decompressor
                ((chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>
                  *)0x19f0d4);
      break;
    default:
      local_ea = 1;
      uVar3 = __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      chunk_error::chunk_error((chunk_error *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      local_ea = 0;
      __cxa_throw(uVar3,&chunk_error::typeinfo,slice_error::~slice_error);
    }
    iVar1 = *(int *)(local_18 + 0x1c);
    if (iVar1 != 0) {
      if (iVar1 - 1U < 2) {
        sVar4 = slice_reader::read(local_10,(int)local_f2,(void *)0x8,(size_t)__nbytes);
        if (sVar4 != 8) {
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
          chunk_error::chunk_error
                    ((chunk_error *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          __cxa_throw(this,&chunk_error::typeinfo,slice_error::~slice_error);
        }
        crypto::hasher::hasher(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
        crypto::hasher::update
                  (in_stack_fffffffffffffb90,
                   (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (size_t)in_stack_fffffffffffffb80);
        std::__cxx11::string::c_str();
        std::__cxx11::string::length();
        crypto::hasher::update
                  (in_stack_fffffffffffffb90,
                   (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (size_t)in_stack_fffffffffffffb80);
        crypto::hasher::finalize(in_stack_fffffffffffffb90);
        std::
        unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x19f417);
        anon_unknown_2::inno_arc4_crypter::inno_arc4_crypter
                  ((inno_arc4_crypter *)in_stack_fffffffffffffb90,
                   (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (size_t)in_stack_fffffffffffffb80);
        boost::iostreams::detail::
        chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
        ::push<stream::(anonymous_namespace)::inno_arc4_crypter>
                  (in_stack_fffffffffffffba0,(inno_arc4_crypter *)in_stack_fffffffffffffb98,
                   (streamsize)in_stack_fffffffffffffb90,
                   CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   in_stack_fffffffffffffb80);
      }
      else if (iVar1 == 3) {
        lVar5 = std::__cxx11::string::length();
        if (lVar5 != 0x38) {
          uVar3 = __cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
          chunk_error::chunk_error
                    ((chunk_error *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          __cxa_throw(uVar3,&chunk_error::typeinfo,slice_error::~slice_error);
        }
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffb90 =
             (hasher *)
             util::endianness<util::little_endian>::load<unsigned_long>
                       ((char *)in_stack_fffffffffffffb78);
        util::endianness<util::little_endian>::store<unsigned_long>
                  ((unsigned_long)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78);
        value = (uint)((ulong)in_stack_fffffffffffffb80 >> 0x20);
        in_stack_fffffffffffffb8c =
             util::endianness<util::little_endian>::load<unsigned_int>
                       ((char *)in_stack_fffffffffffffb78);
        util::endianness<util::little_endian>::store<unsigned_int>
                  (value,(char *)in_stack_fffffffffffffb78);
        in_stack_fffffffffffffb80 =
             (inno_xchacha20_crypter *)
             std::
             unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x19f5f2);
        std::__cxx11::string::c_str();
        anon_unknown_2::inno_xchacha20_crypter::inno_xchacha20_crypter
                  (in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,(char *)0x19f61c);
        boost::iostreams::detail::
        chain_base<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input>
        ::push<stream::(anonymous_namespace)::inno_xchacha20_crypter>
                  (in_stack_fffffffffffffba0,(inno_xchacha20_crypter *)in_stack_fffffffffffffb98,
                   (streamsize)in_stack_fffffffffffffb90,
                   CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   in_stack_fffffffffffffb80);
      }
    }
    std::
    unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((unique_ptr<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x19f652);
    restrict<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>>
              ((slice_reader *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               (uint64_t)in_stack_fffffffffffffb80);
    boost::iostreams::detail::
    chain_base<boost::iostreams::chain<boost::iostreams::input,char,std::char_traits<char>,std::allocator<char>>,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
    ::push<stream::restricted_source<stream::slice_reader>>
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
               (streamsize)in_stack_fffffffffffffb90,
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               in_stack_fffffffffffffb80);
    return (__uniq_ptr_data<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(tuple<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_RDI.
               super___uniq_ptr_impl<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_boost::iostreams::chain<boost::iostreams::input,_char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  }
  local_82 = 1;
  uVar3 = __cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  chunk_error::chunk_error((chunk_error *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  local_82 = 0;
  __cxa_throw(uVar3,&chunk_error::typeinfo,slice_error::~slice_error);
}

Assistant:

chunk_reader::pointer chunk_reader::get(slice_reader & base, const chunk & chunk , const std::string & key) {
	
	if(!base.seek(chunk.first_slice, chunk.offset)) {
		throw chunk_error("could not seek to chunk start");
	}
	
	char magic[sizeof(chunk_id)];
	if(base.read(magic, 4) != 4 || std::memcmp(magic, chunk_id, sizeof(chunk_id)) != 0) {
		throw chunk_error("bad chunk magic");
	}
	
	pointer result(new boost::iostreams::chain<boost::iostreams::input>);
	
	switch(chunk.compression) {
		case Stored: break;
		case Zlib:   result->push(io::zlib_decompressor(), 8192); break;
		case BZip2:  result->push(io::bzip2_decompressor(), 8192); break;
	#if INNOEXTRACT_HAVE_LZMA
		case LZMA1:  result->push(inno_lzma1_decompressor(), 8192); break;
		case LZMA2:  result->push(inno_lzma2_decompressor(), 8192); break;
	#else
		case LZMA1: case LZMA2:
			throw chunk_error("LZMA decompression not supported by this "
			                  + std::string(innoextract_name) + " build");
	#endif
		default: throw chunk_error("unknown chunk compression");
	}
	
	switch(chunk.encryption) {
		case Plaintext: break;
		#if INNOEXTRACT_HAVE_DECRYPTION
		case ARC4_MD5: /* fall-through */
		case ARC4_SHA1: {
			char salt[8];
			if(base.read(salt, 8) != 8) {
				throw chunk_error("could not read chunk salt");
			}
			crypto::hasher hasher(chunk.encryption == ARC4_SHA1 ? crypto::SHA1 : crypto::MD5);
			hasher.update(salt, sizeof(salt));
			hasher.update(key.c_str(), key.length());
			crypto::checksum checksum = hasher.finalize();
			const char * salted_key = chunk.encryption == ARC4_SHA1 ? checksum.sha1 : checksum.md5;
			size_t key_length = chunk.encryption == ARC4_SHA1 ? sizeof(checksum.sha1) : sizeof(checksum.md5);
			result->push(inno_arc4_crypter(salted_key, key_length), 8192);
			break;
		}
		case XChaCha20: {
			if(key.length() != crypto::xchacha20::key_size + crypto::xchacha20::nonce_size) {
				throw chunk_error("unexpected key size");
			}
			char nonce[crypto::xchacha20::nonce_size];
			std::memcpy(nonce, key.c_str() + crypto::xchacha20::key_size, crypto::xchacha20::nonce_size);
			util::little_endian::store(util::little_endian::load<boost::uint64_t>(nonce) ^ chunk.offset, nonce);
			util::little_endian::store(util::little_endian::load<boost::uint32_t>(nonce + 8) ^ chunk.first_slice, nonce + 8);
			result->push(inno_xchacha20_crypter(key.c_str(), nonce), 8192);
			break;
		}
		#else
		default: (void)key, throw chunk_error("XChaCha20 decryption not supported in this build");
		#endif
	}
	
	result->push(restrict(base, chunk.size));
	
	return result;
}